

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::draw
          (list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,canvas *c)

{
  list_box_style *plVar1;
  data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pdVar2;
  rectangle *prVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  rectangle r;
  
  scrollable_region::draw(&this->super_scrollable_region,c);
  prVar3 = scrollable_region::display_rect(&this->super_scrollable_region);
  lVar6 = (c->super_rectangle).l;
  if (lVar6 < prVar3->l) {
    lVar6 = prVar3->l;
  }
  lVar8 = (c->super_rectangle).t;
  if (lVar8 < prVar3->t) {
    lVar8 = prVar3->t;
  }
  lVar9 = (c->super_rectangle).r;
  lVar5 = prVar3->r;
  if (lVar9 < prVar3->r) {
    lVar5 = lVar9;
  }
  lVar9 = (c->super_rectangle).b;
  lVar4 = prVar3->b;
  if (lVar9 < prVar3->b) {
    lVar4 = lVar9;
  }
  if ((lVar8 <= lVar4) && (lVar6 <= lVar5)) {
    plVar1 = (this->style)._M_t.
             super___uniq_ptr_impl<dlib::list_box_style,_std::default_delete<dlib::list_box_style>_>
             ._M_t.
             super__Tuple_impl<0UL,_dlib::list_box_style_*,_std::default_delete<dlib::list_box_style>_>
             .super__Head_base<0UL,_dlib::list_box_style_*,_false>._M_head_impl;
    prVar3 = scrollable_region::display_rect(&this->super_scrollable_region);
    (*plVar1->_vptr_list_box_style[2])
              (plVar1,c,prVar3,(ulong)(this->super_scrollable_region).super_drawable.enabled);
    prVar3 = scrollable_region::total_rect(&this->super_scrollable_region);
    if ((this->items).array_size != 0) {
      lVar9 = 0;
      uVar7 = 0;
      lVar6 = prVar3->t;
      do {
        lVar5 = *(long *)((long)&((this->items).array_elements)->height + lVar9) + lVar6;
        if (lVar8 < lVar5) {
          prVar3 = scrollable_region::total_rect(&this->super_scrollable_region);
          lVar5 = prVar3->l;
          prVar3 = scrollable_region::display_rect(&this->super_scrollable_region);
          r.r = prVar3->r;
          r.b = *(long *)((long)&((this->items).array_elements)->height + lVar9) + lVar6 + -1;
          plVar1 = (this->style)._M_t.
                   super___uniq_ptr_impl<dlib::list_box_style,_std::default_delete<dlib::list_box_style>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_dlib::list_box_style_*,_std::default_delete<dlib::list_box_style>_>
                   .super__Head_base<0UL,_dlib::list_box_style_*,_false>._M_head_impl;
          r.l = lVar5;
          r.t = lVar6;
          prVar3 = scrollable_region::display_rect(&this->super_scrollable_region);
          pdVar2 = (this->items).array_elements;
          (*plVar1->_vptr_list_box_style[3])
                    (plVar1,c,&r,prVar3,
                     (ulong)(this->super_scrollable_region).super_drawable.enabled,
                     (this->super_scrollable_region).super_drawable.mfont.
                     super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)&(pdVar2->name)._M_dataplus._M_p + lVar9,
                     (ulong)(&pdVar2->is_selected)[lVar9]);
          lVar5 = lVar6 + *(long *)((long)&((this->items).array_elements)->height + lVar9);
          if (lVar4 < lVar5) {
            return;
          }
        }
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 0x38;
        lVar6 = lVar5;
      } while (uVar7 < (this->items).array_size);
    }
  }
  return;
}

Assistant:

void list_box<S>::
    draw (
        const canvas& c
    ) const
    {
        scrollable_region::draw(c);

        rectangle area = display_rect().intersect(c);
        if (area.is_empty())
            return;

        style->draw_list_box_background(c, display_rect(), enabled);

        long y = total_rect().top();
        for (unsigned long i = 0; i < items.size(); ++i)
        {
            if (y+(long)items[i].height <= area.top())
            {
                y += items[i].height;
                continue;
            }

            rectangle r(total_rect().left(), y, display_rect().right(), y+items[i].height-1);

            style->draw_list_box_item(c,r, display_rect(), enabled, *mfont, items[i].name, items[i].is_selected);


            y += items[i].height;

            if (y > area.bottom())
                break;
        }
    }